

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

xmlChar * htmlFindEncoding(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  long lVar4;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return (xmlChar *)0x0;
  }
  pxVar2 = ctxt->input;
  if (((((pxVar2 != (xmlParserInputPtr)0x0) && ((pxVar2->flags & 1) == 0)) &&
       (pxVar2->cur != (xmlChar *)0x0)) &&
      ((pxVar2->end != (xmlChar *)0x0 && (*pxVar2->end == '\0')))) &&
     ((pxVar3 = xmlStrcasestr(pxVar2->cur,(xmlChar *)"HTTP-EQUIV"), pxVar3 != (xmlChar *)0x0 &&
      ((pxVar3 = xmlStrcasestr(pxVar3,(xmlChar *)"CONTENT"), pxVar3 != (xmlChar *)0x0 &&
       (pxVar3 = xmlStrcasestr(pxVar3,(xmlChar *)"CHARSET="), pxVar3 != (xmlChar *)0x0)))))) {
    lVar4 = 0;
    while (((bVar1 = pxVar3[lVar4 + 8], (byte)(bVar1 - 0x30) < 10 ||
            ((byte)((bVar1 | 0x20) + 0x9f) < 0x1a)) ||
           ((bVar1 - 0x2d < 0x33 && ((0x4000000002005U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0))
           ))) {
      lVar4 = lVar4 + 1;
    }
    if (lVar4 != 0) {
      pxVar3 = xmlStrndup(pxVar3 + 8,(int)lVar4);
      if (pxVar3 != (xmlChar *)0x0) {
        return pxVar3;
      }
      xmlCtxtErrMemory(ctxt);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
htmlFindEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *start, *cur, *end;
    xmlChar *ret;

    if ((ctxt == NULL) || (ctxt->input == NULL) ||
        (ctxt->input->flags & XML_INPUT_HAS_ENCODING))
        return(NULL);
    if ((ctxt->input->cur == NULL) || (ctxt->input->end == NULL))
        return(NULL);

    start = ctxt->input->cur;
    end = ctxt->input->end;
    /* we also expect the input buffer to be zero terminated */
    if (*end != 0)
        return(NULL);

    cur = xmlStrcasestr(start, BAD_CAST "HTTP-EQUIV");
    if (cur == NULL)
        return(NULL);
    cur = xmlStrcasestr(cur, BAD_CAST  "CONTENT");
    if (cur == NULL)
        return(NULL);
    cur = xmlStrcasestr(cur, BAD_CAST  "CHARSET=");
    if (cur == NULL)
        return(NULL);
    cur += 8;
    start = cur;
    while ((IS_ALNUM(*cur)) ||
           (*cur == '-') || (*cur == '_') || (*cur == ':') || (*cur == '/'))
           cur++;
    if (cur == start)
        return(NULL);
    ret = xmlStrndup(start, cur - start);
    if (ret == NULL)
        htmlErrMemory(ctxt);
    return(ret);
}